

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::type_can_zero_initialize(CompilerGLSL *this,SPIRType *type)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  bool bVar3;
  SPIRType *type_00;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  if (type->pointer != false) {
    return false;
  }
  if (((type->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
     ((this->options).flatten_multidimensional_arrays == false)) {
    sVar1 = (type->array_size_literal).super_VectorView<bool>.buffer_size;
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        if ((type->array_size_literal).super_VectorView<bool>.ptr[sVar4] == false)
        goto LAB_00133d1e;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      pTVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               ptr;
      lVar5 = 0;
      do {
        type_00 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)((long)&pTVar2->id + lVar5));
        bVar3 = type_can_zero_initialize(this,type_00);
        if (!bVar3) {
          return bVar3;
        }
        bVar6 = sVar1 * 4 + -4 != lVar5;
        lVar5 = lVar5 + 4;
      } while (bVar6);
    }
  }
  else {
LAB_00133d1e:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompilerGLSL::type_can_zero_initialize(const SPIRType &type) const
{
	if (type.pointer)
		return false;

	if (!type.array.empty() && options.flatten_multidimensional_arrays)
		return false;

	for (auto &literal : type.array_size_literal)
		if (!literal)
			return false;

	for (auto &memb : type.member_types)
		if (!type_can_zero_initialize(get<SPIRType>(memb)))
			return false;

	return true;
}